

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::full_box::parse(full_box *this,char *ptr)

{
  uint uVar1;
  ulong uVar2;
  
  box::parse(&this->super_box,ptr);
  uVar2 = (ulong)((uint)(this->super_box).has_uuid_ * 0x10 + (uint)(this->super_box).is_large_ * 8);
  uVar1 = *(uint *)(ptr + uVar2 + 8);
  this->magic_conf_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  (this->super_box).field_0x62 = ptr[uVar2 + 8];
  uVar1 = *(uint *)(ptr + uVar2 + 8);
  *(uint *)&(this->super_box).field_0x64 =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8;
  return;
}

Assistant:

void full_box::parse(char const *ptr)
	{
		box::parse(ptr);
		// read the version and flags
		uint64_t offset = box::size();
		magic_conf_ = fmp4_read_uint32(ptr + offset);
		this->version_ = *((const uint8_t *)((ptr + offset)));
		this->flags_ = ((uint32_t)(0x00FFFFFF)) & fmp4_read_uint32(ptr + offset);
	}